

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllFormatsStoreGeometryStages::Write<tcu::Vector<int,4>>
          (BasicAllFormatsStoreGeometryStages *this,GLenum internalformat,
          Vector<int,_4> *write_value,Vector<int,_4> *expected_value)

{
  CallLogWrapper *this_00;
  _Alloc_hider _Var1;
  _Alloc_hider _Var2;
  long *src_tes;
  _func_int **pp_Var3;
  GLuint GVar4;
  GLint GVar5;
  ostream *poVar6;
  int *pixels;
  char *pcVar7;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  GLenum e_02;
  GLenum e_03;
  Vector<int,_4> *v;
  Vector<int,_4> *v_00;
  int i;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  string local_2c8;
  string local_2a8;
  GLuint texture [4];
  undefined2 local_278;
  undefined6 uStack_276;
  BasicAllFormatsStoreGeometryStages *local_268;
  long *local_260;
  long *local_258;
  long *local_250;
  long local_240 [2];
  long *local_230;
  long local_220 [2];
  long *local_210;
  long local_200 [2];
  long *local_1f0;
  long local_1e0 [2];
  ostringstream os;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_268 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&os,"#version 420 core\nlayout(",0x19);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_2a8,(void *)(ulong)internalformat,e);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (&os.super_basic_ostream<char,_std::char_traits<char>_>,
                      local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") writeonly uniform ",0x14);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_2c8.field_2._M_allocated_capacity._0_2_ = 0x69;
  local_2c8._M_string_length = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2c8._M_dataplus._M_p,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "image2DArray g_image0;\nvoid main() {\n  ivec3 coord = ivec3(gl_VertexID, 0, 0);\n  imageStore(g_image0, coord, "
             ,0x6d);
  local_278 = 0x69;
  texture[2] = 1;
  texture[3] = 0;
  texture._0_8_ = &local_278;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_278,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,write_value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,");\n}",4);
  if ((undefined2 *)texture._0_8_ != &local_278) {
    operator_delete((void *)texture._0_8_,CONCAT62(uStack_276,local_278) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,
                    CONCAT62(local_2c8.field_2._M_allocated_capacity._2_6_,
                             local_2c8.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::ios_base::~ios_base
            ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  local_258 = local_1f0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__ostream_insert<char,std::char_traits<char>>
            (&os.super_basic_ostream<char,_std::char_traits<char>_>,
             "#version 420 core\nlayout(vertices = 1) out;\nlayout(",0x33);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_2a8,(void *)(ulong)internalformat,e_00);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (&os.super_basic_ostream<char,_std::char_traits<char>_>,
                      local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") writeonly uniform ",0x14);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_2c8.field_2._M_allocated_capacity._0_2_ = 0x69;
  local_2c8._M_string_length = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2c8._M_dataplus._M_p,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "image2DArray g_image1;\nvoid main() {\n  gl_TessLevelInner[0] = 1;\n  gl_TessLevelInner[1] = 1;\n  gl_TessLevelOuter[0] = 1;\n  gl_TessLevelOuter[1] = 1;\n  gl_TessLevelOuter[2] = 1;\n  gl_TessLevelOuter[3] = 1;\n  ivec3 coord = ivec3(gl_PrimitiveID, 0, 0);\n  imageStore(g_image1, coord, "
             ,0x118);
  local_278 = 0x69;
  texture[2] = 1;
  texture[3] = 0;
  texture._0_8_ = &local_278;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_278,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,write_value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,");\n}",4);
  if ((undefined2 *)texture._0_8_ != &local_278) {
    operator_delete((void *)texture._0_8_,CONCAT62(uStack_276,local_278) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,
                    CONCAT62(local_2c8.field_2._M_allocated_capacity._2_6_,
                             local_2c8.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::ios_base::~ios_base
            ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  local_260 = local_210;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__ostream_insert<char,std::char_traits<char>>
            (&os.super_basic_ostream<char,_std::char_traits<char>_>,
             "#version 420 core\nlayout(triangles, point_mode) in;\nlayout(",0x3b);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_2a8,(void *)(ulong)internalformat,e_01);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (&os.super_basic_ostream<char,_std::char_traits<char>_>,
                      local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") writeonly uniform ",0x14);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_2c8.field_2._M_allocated_capacity._0_2_ = 0x69;
  local_2c8._M_string_length = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2c8._M_dataplus._M_p,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "image2DArray g_image2;\nvoid main() {\n  ivec3 coord = ivec3(gl_PrimitiveID, 0, 0);\n  imageStore(g_image2, coord, "
             ,0x70);
  local_278 = 0x69;
  texture[2] = 1;
  texture[3] = 0;
  texture._0_8_ = &local_278;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_278,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,write_value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,");\n}",4);
  if ((undefined2 *)texture._0_8_ != &local_278) {
    operator_delete((void *)texture._0_8_,CONCAT62(uStack_276,local_278) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,
                    CONCAT62(local_2c8.field_2._M_allocated_capacity._2_6_,
                             local_2c8.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::ios_base::~ios_base
            ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  src_tes = local_230;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__ostream_insert<char,std::char_traits<char>>
            (&os.super_basic_ostream<char,_std::char_traits<char>_>,
             "#version 420 core\nlayout(points) in;\nlayout(points, max_vertices = 1) out;\nlayout("
             ,0x52);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_2a8,(void *)(ulong)internalformat,e_02);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (&os.super_basic_ostream<char,_std::char_traits<char>_>,
                      local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") writeonly uniform ",0x14);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_2c8.field_2._M_allocated_capacity._0_2_ = 0x69;
  local_2c8._M_string_length = 1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2c8._M_dataplus._M_p,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "image2DArray g_image3;\nvoid main() {\n  ivec3 coord = ivec3(gl_PrimitiveIDIn, 0, 0);\n  imageStore(g_image3, coord, "
             ,0x72);
  local_278 = 0x69;
  texture[2] = 1;
  texture[3] = 0;
  texture._0_8_ = &local_278;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_278,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec4",4);
  poVar6 = tcu::operator<<(poVar6,write_value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,");\n}",4);
  if ((undefined2 *)texture._0_8_ != &local_278) {
    operator_delete((void *)texture._0_8_,CONCAT62(uStack_276,local_278) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,
                    CONCAT62(local_2c8.field_2._M_allocated_capacity._2_6_,
                             local_2c8.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::ios_base::~ios_base
            ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  GVar4 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                    ((ShaderImageLoadStoreBase *)local_268,(char *)local_258,(char *)local_260,
                     (char *)src_tes,(char *)local_250,(char *)0x0,(bool *)0x0);
  if (local_250 != local_240) {
    operator_delete(local_250,local_240[0] + 1);
  }
  if (local_230 != local_220) {
    operator_delete(local_230,local_220[0] + 1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  pixels = (int *)operator_new(0x10);
  pixels[0] = 0;
  pixels[1] = 0;
  pixels[2] = 0;
  pixels[3] = 0;
  this_00 = (CallLogWrapper *)(local_268 + 8);
  glu::CallLogWrapper::glGenTextures(this_00,4,texture);
  lVar8 = 0;
  do {
    glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,texture[lVar8]);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage3D(this_00,0x8c1a,0,internalformat,1,1,1,0,0x8d99,0x1404,pixels);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,0);
  glu::CallLogWrapper::glUseProgram(this_00,GVar4);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_image0");
  glu::CallLogWrapper::glUniform1i(this_00,GVar5,0);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_image1");
  glu::CallLogWrapper::glUniform1i(this_00,GVar5,1);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_image2");
  glu::CallLogWrapper::glUniform1i(this_00,GVar5,2);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_image3");
  glu::CallLogWrapper::glUniform1i(this_00,GVar5,3);
  lVar8 = 0;
  do {
    glu::CallLogWrapper::glBindImageTexture
              (this_00,(GLuint)lVar8,texture[lVar8],0,'\x01',0,0x88b9,internalformat);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  glu::CallLogWrapper::glBindVertexArray(this_00,*(GLuint *)(local_268 + 0x28));
  glu::CallLogWrapper::glPatchParameteri(this_00,0x8e72,1);
  glu::CallLogWrapper::glDrawArrays(this_00,0xe,0,1);
  glu::CallLogWrapper::glPatchParameteri(this_00,0x8e72,3);
  local_268 = (BasicAllFormatsStoreGeometryStages *)CONCAT44(local_268._4_4_,GVar4);
  uVar9 = 0;
  bVar10 = false;
  while( true ) {
    glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,texture[uVar9]);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
    glu::CallLogWrapper::glGetTexImage(this_00,0x8c1a,0,0x8d99,0x1404,pixels);
    if ((((*pixels != expected_value->m_data[0]) || (pixels[1] != expected_value->m_data[1])) ||
        (pixels[2] != expected_value->m_data[2])) || (pixels[3] != expected_value->m_data[3]))
    break;
    bVar10 = 2 < uVar9;
    uVar9 = uVar9 + 1;
    if (uVar9 == 4) {
      glu::CallLogWrapper::glDeleteTextures(this_00,4,texture);
      GVar4 = (GLuint)local_268;
      glu::CallLogWrapper::glUseProgram(this_00,0);
      glu::CallLogWrapper::glDeleteProgram(this_00,GVar4);
LAB_0099e014:
      operator_delete(pixels,0x10);
      return bVar10;
    }
  }
  glu::CallLogWrapper::glDeleteTextures(this_00,4,texture);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,(GLuint)local_268);
  local_48 = *(undefined8 *)pixels;
  uStack_40 = *(undefined8 *)(pixels + 2);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>((string *)&os,&local_48,v);
  pp_Var3 = os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
  local_58 = *(undefined8 *)expected_value->m_data;
  uStack_50 = *(undefined8 *)(expected_value->m_data + 2);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_2a8,&local_58,v_00);
  _Var2._M_p = local_2a8._M_dataplus._M_p;
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_2c8,(void *)(ulong)internalformat,e_03);
  _Var1._M_p = local_2c8._M_dataplus._M_p;
  pcVar7 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::StageName
                     ((ShaderImageLoadStoreBase *)(uVar9 & 0xffffffff),internalformat);
  gl4cts::anon_unknown_0::Output
            ("Value is: %s. Value should be: %s. Format is: %s. Stage is: %s.\n",pp_Var3,_Var2._M_p,
             _Var1._M_p,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,
                    CONCAT62(local_2c8.field_2._M_allocated_capacity._2_6_,
                             local_2c8.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if (os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    os.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  goto LAB_0099e014;
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const GLuint program =
			BuildProgram(GenVS(internalformat, write_value).c_str(), GenTCS(internalformat, write_value).c_str(),
						 GenTES(internalformat, write_value).c_str(), GenGS(internalformat, write_value).c_str(), NULL);
		const int	  kSize = 1;
		std::vector<T> data(kSize * kSize);
		GLuint		   texture[4];
		glGenTextures(4, texture);

		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(GL_TEXTURE_2D_ARRAY, texture[i]);
			glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, internalformat, kSize, kSize, 1, 0, Format<T>(), Type<T>(), &data[0]);
		}
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);

		glUseProgram(program);
		glUniform1i(glGetUniformLocation(program, "g_image0"), 0);
		glUniform1i(glGetUniformLocation(program, "g_image1"), 1);
		glUniform1i(glGetUniformLocation(program, "g_image2"), 2);
		glUniform1i(glGetUniformLocation(program, "g_image3"), 3);
		for (GLuint i = 0; i < 4; ++i)
		{
			glBindImageTexture(i, texture[i], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		}
		glBindVertexArray(m_vao);
		glPatchParameteri(GL_PATCH_VERTICES, 1);
		glDrawArrays(GL_PATCHES, 0, 1);
		glPatchParameteri(GL_PATCH_VERTICES, 3);

		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(GL_TEXTURE_2D_ARRAY, texture[i]);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGetTexImage(GL_TEXTURE_2D_ARRAY, 0, Format<T>(), Type<T>(), &data[0]);

			if (!Equal(data[0], expected_value, internalformat))
			{
				glDeleteTextures(4, texture);
				glUseProgram(0);
				glDeleteProgram(program);
				Output("Value is: %s. Value should be: %s. Format is: %s. Stage is: %s.\n", ToString(data[0]).c_str(),
					   ToString(expected_value).c_str(), FormatEnumToString(internalformat).c_str(), StageName(i));
				return false;
			}
		}
		glDeleteTextures(4, texture);
		glUseProgram(0);
		glDeleteProgram(program);
		return true;
	}